

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Tools.hpp
# Opt level: O3

bool unicpp::is_valid_utf8<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  local_20._M_current = begin._M_current;
  while (local_20._M_current != end._M_current) {
    iterate_next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&local_20,end);
  }
  return local_20._M_current == end._M_current;
}

Assistant:

bool is_valid_utf8(InputIterator begin, InputIterator end)
{
    unsigned char buffer[4];
    for(auto it = begin; it != end; )
    {
        try
        {
            iterate_next(it, end);
        }
        catch(...) // Some kind of exception was thrown when interpreting the UTF-8, so it's invalid
        {
            return false;
        }
    }

    return true;
}